

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall CImage::~CImage(CImage *this)

{
  if (this->m_pBitmap != (uchar *)0x0) {
    free(this->m_pBitmap);
    this->m_pBitmap = (uchar *)0x0;
  }
  this->m_Xres = 0;
  this->m_Yres = 0;
  this->m_NumPixel = 0;
  this->m_BitPerPixel = 0;
  return;
}

Assistant:

DLL CImage::~CImage()
{
  Destroy();
}